

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

void errorlist_destroy(ErrorList *list)

{
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  ErrorItem *pEVar2;
  ErrorItem *pEVar3;
  
  if (list == (ErrorList *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = list->f;
  pvVar1 = list->d;
  pEVar3 = (list->head).next;
  while (pEVar3 != (ErrorItem *)0x0) {
    pEVar2 = pEVar3->next;
    (*UNRECOVERED_JUMPTABLE)((pEVar3->error).error,pvVar1);
    (*UNRECOVERED_JUMPTABLE)((pEVar3->error).filename,pvVar1);
    (*UNRECOVERED_JUMPTABLE)(pEVar3,pvVar1);
    pEVar3 = pEVar2;
  }
  (*UNRECOVERED_JUMPTABLE)(list,pvVar1);
  return;
}

Assistant:

void errorlist_destroy(ErrorList *list)
{
    if (list == NULL)
        return;

    MOJOSHADER_free f = list->f;
    void *d = list->d;
    ErrorItem *item = list->head.next;
    while (item != NULL)
    {
        ErrorItem *next = item->next;
        f((void *) item->error.error, d);
        f((void *) item->error.filename, d);
        f(item, d);
        item = next;
    } // while
    f(list, d);
}